

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_oom.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b802::
ARTOOMTest_Node48KeyPrefixSplit_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTOOMTest_Node48KeyPrefixSplit_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *verifier_00;
  undefined1 local_180 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  Message local_90 [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  AssertHelper local_38;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&unodb::detail::deallocation_request::deallocate.e_phoff;
  verifier_00 = (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)0x0;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_180,false);
  TestBody::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)local_180,verifier_00);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68.field_2._M_allocated_capacity = 0;
  local_68.field_2._8_8_ = 0;
  local_68._M_string_length = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    anon_func::anon_class_24_2_94731f54::operator()
              ((anon_class_24_2_94731f54 *)
               &verifier.key_views.
                super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *)local_180);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&local_68,
             "Expected: test(verifier) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
            );
  testing::Message::Message(local_90);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_oom.cpp"
             ,0x30,local_68._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_38,local_90);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (local_90[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_90[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&local_68);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ~tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)local_180);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTOOMTest, Node48KeyPrefixSplit) {
  oom_insert_test<TypeParam>(
      3,
      [](unodb::test::tree_verifier<TypeParam>& verifier) {
        verifier.insert_key_range(10, 17);
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({17, 0, 0, 1, 0});
        verifier.assert_growing_inodes({1, 1, 1, 0});
        verifier.assert_key_prefix_splits(0);
#endif  // UNODB_DETAIL_WITH_STATS
      },
      // Insert a value that does share full prefix with the current Node48
      0x100020, unodb::test::test_values[0],
      [](unodb::test::tree_verifier<TypeParam>&
#ifdef UNODB_DETAIL_WITH_STATS
             verifier
#endif  // UNODB_DETAIL_WITH_STATS
      ) {
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({18, 1, 0, 1, 0});
        verifier.assert_growing_inodes({2, 1, 1, 0});
        verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS
      });
}